

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O1

bool __thiscall VolumeFile::load(VolumeFile *this,string *filePath)

{
  ifstream *stream;
  pointer *ppuVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint64_t uVar6;
  undefined4 extraout_var;
  VolumeFile *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> headerData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  ppuVar1 = &local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pcVar2 = (filePath->_M_dataplus)._M_p;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + filePath->_M_string_length);
  std::__cxx11::string::operator=((string *)&this->m_origPath,(string *)&local_48);
  if ((pointer *)
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  boost::filesystem::path::parent_path();
  std::__cxx11::string::operator=((string *)&this->m_basePath,(string *)&local_48);
  if ((pointer *)
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  boost::filesystem::path::filename();
  std::__cxx11::string::operator=((string *)&this->m_baseName,(string *)&local_48);
  if ((pointer *)
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  stream = &this->m_mainStream;
  std::ifstream::open((string *)stream,(_Ios_Openmode)filePath);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::istream::seekg((long)stream,_S_beg);
    uVar6 = std::istream::tellg();
    this->m_mainFileSize = uVar6;
    std::istream::seekg((long)stream,_S_beg);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this;
    iVar5 = (*this->_vptr_VolumeFile[3])();
    readDataAt(this_00,stream,&local_48,0,CONCAT44(extraout_var,iVar5));
    iVar5 = (*this->_vptr_VolumeFile[7])
                      (this,local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (long)local_48.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (((char)iVar5 == '\0') ||
       (iVar5 = (*this->_vptr_VolumeFile[6])
                          (this,local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                           (long)local_48.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_48.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start), (char)iVar5 == '\0')) {
      bVar4 = false;
    }
    else {
      bVar4 = parseSegment(this);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool VolumeFile::load(const std::string& filePath)
{
	m_origPath = boost::filesystem::path(filePath);
	m_basePath = m_origPath.parent_path();
	m_baseName = m_origPath.filename();

	if (!prepareStream(m_mainStream, filePath, &m_mainFileSize)) {
		return false;
	}

	std::vector<uint8_t> headerData;
	if (!readDataAt(headerData, 0, getHeaderSize())) {
		return false;
	}
	if (!decryptHeader(headerData.data(), headerData.size())) {
		return false;
	}
	if (!parseHeader(headerData.data(), headerData.size())) {
		return false;
	}
	if (!parseSegment()) {
		return false;
	}

	return true;
}